

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<only_assigned_on_reset::MainVisitor,_true,_true,_false,_false>::
visit<slang::ast::HierarchicalValueExpression>
          (ASTVisitor<only_assigned_on_reset::MainVisitor,_true,_true,_false,_false> *this,
          HierarchicalValueExpression *t)

{
  bool bVar1;
  HierarchicalValueExpression *in_RSI;
  ASTVisitor<only_assigned_on_reset::MainVisitor,_true,_true,_false,_false> *in_RDI;
  
  bVar1 = Expression::bad((Expression *)in_RSI);
  if (!bVar1) {
    visitDefault<slang::ast::HierarchicalValueExpression>(in_RDI,in_RSI);
  }
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (!VisitBad && requires { t.bad(); }) {
            if (t.bad())
                return;
        }

        if constexpr (requires { (DERIVED).handle(t); })
            (DERIVED).handle(t);
        else if constexpr (requires { (DERIVED)(DERIVED, t); })
            (DERIVED)(DERIVED, t);
        else
            visitDefault(t);
    }